

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::collate_impl(collate_impl<wchar_t> *this,cdata *d)

{
  long lVar1;
  string asStack_48 [32];
  
  collator<wchar_t>::collator(&this->super_collator<wchar_t>,0);
  *(undefined ***)&this->super_collator<wchar_t> = &PTR__collate_impl_001dacd8;
  std::__cxx11::string::string(asStack_48,(string *)&d->encoding);
  (this->cvt_).mode_ = cvt_skip;
  std::__cxx11::string::~string(asStack_48);
  icu_70::Locale::Locale(&this->locale_,&d->locale);
  lVar1 = 0;
  do {
    thread_specific_ptr<icu_70::Collator>::thread_specific_ptr
              ((thread_specific_ptr<icu_70::Collator> *)((long)&this->collates_[0].key_.p_ + lVar1))
    ;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x28);
  this->is_utf8_ = d->utf8;
  return;
}

Assistant:

collate_impl(cdata const &d) : 
                    cvt_(d.encoding),
                    locale_(d.locale),
                    is_utf8_(d.utf8)
                {
                
                }